

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data2pvd.cpp
# Opt level: O1

int transformMercuryToVTK<3ul>(MercuryDataFile *infile,string *prefix)

{
  pointer pcVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  int iVar5;
  type pVVar6;
  ostream *poVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  byte bVar11;
  size_t timestepCount;
  string strippedPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  VTKPointDescriptor<MercuryParticle<3UL>_> descriptor;
  MercuryTimeStepIterator<3UL> __begin0;
  MercuryTimeStepIterator<3UL> __end0;
  VTKUnstructuredGrid<MercuryParticle<3UL>_> timeStepFile;
  ostringstream filename;
  VTKCollection collection;
  long local_8c8;
  undefined1 *local_8c0;
  long local_8b8;
  undefined1 local_8b0 [16];
  undefined8 local_8a0;
  string local_898;
  undefined1 *local_878 [2];
  undefined1 local_868 [16];
  string local_858;
  string local_838;
  VTKPointDescriptor<MercuryParticle<3UL>_> local_818;
  undefined1 *local_7f0 [2];
  undefined1 local_7e0 [16];
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  undefined1 *local_750 [2];
  undefined1 local_740 [16];
  MercuryTimeStepIterator<3UL> local_730;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 local_670;
  vector<MercuryParticle<3UL>,_std::allocator<MercuryParticle<3UL>_>_> vStack_668;
  char local_650;
  undefined7 uStack_64f;
  undefined8 uStack_648;
  undefined8 local_638 [10];
  vector<MercuryParticle<3UL>,_std::allocator<MercuryParticle<3UL>_>_> local_5e8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  VTKPointDescriptor<MercuryParticle<3UL>_> *local_5c0;
  long local_5b8;
  filebuf local_5b0 [24];
  int aiStack_598 [54];
  ios_base local_4c0 [264];
  ostringstream local_3b8 [112];
  ios_base local_348 [264];
  VTKCollection local_240;
  
  bVar11 = 0;
  local_818.entries_.
  super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<3UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<3UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_818.positionEntry_ = (VTKPointDescriptorEntry<MercuryParticle<3UL>_> *)0x0;
  local_818.entries_.
  super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<3UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<3UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_818.entries_.
  super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<3UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<3UL>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"Position","");
  pVVar6 = VTKPointDescriptor<MercuryParticle<3UL>_>::addProperty<double[3]>
                     (&local_818,&local_838,0,true);
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"Velocity","");
  pVVar6 = VTKPointDescriptor<MercuryParticle<3UL>_>::addProperty<double[3]>
                     (pVVar6,&local_770,0x18,false);
  local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"Rotation","");
  pVVar6 = VTKPointDescriptor<MercuryParticle<3UL>_>::addProperty<double[3]>
                     (pVVar6,&local_790,0x30,false);
  local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"AngVelocity","");
  pVVar6 = VTKPointDescriptor<MercuryParticle<3UL>_>::addProperty<double[3]>
                     (pVVar6,&local_858,0x48,false);
  local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"Radius","");
  pVVar6 = VTKPointDescriptor<MercuryParticle<3UL>_>::addProperty<double>
                     (pVVar6,&local_7b0,0x60,false);
  local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"Species","");
  VTKPointDescriptor<MercuryParticle<3UL>_>::addProperty<unsigned_long>
            (pVVar6,&local_7d0,0x68,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
    operator_delete(local_7b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_dataplus._M_p != &local_858.field_2) {
    operator_delete(local_858._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != &local_790.field_2) {
    operator_delete(local_790._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p);
  }
  pcVar1 = (prefix->_M_dataplus)._M_p;
  local_878[0] = local_868;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_878,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)local_878);
  std::ofstream::ofstream(&local_240,(string *)local_878,_S_out);
  local_240.hasHeader_ = false;
  local_240.hasFooter_ = false;
  local_240.recordID_ = 0;
  if (local_878[0] != local_868) {
    operator_delete(local_878[0]);
  }
  if (*(int *)(&local_240.field_0x20 + *(long *)(local_240._0_8_ + -0x18)) != 0) {
    std::enable_if<!((((Log)((signed_char)0))<((Log)-20))||(((Log)0)<((Log)-20))),void>::
    type_Logger<(Log)0>::operator()
              ((type_Logger<(Log)0> *)&logger,
               "Could not open \'%.pvd\' for output.\nPlease make sure you have the appropriate permissions and try again."
               ,prefix);
  }
  local_8c8 = 0;
  std::istream::seekg(infile,0,0);
  MercuryTimeStepIterator<3UL>::MercuryTimeStepIterator(&local_730,infile);
  lVar3 = _VTT;
  local_6b8 = 0;
  uStack_6b0 = 0;
  local_6a8 = 0;
  local_670 = 0;
  vStack_668.super__Vector_base<MercuryParticle<3UL>,_std::allocator<MercuryParticle<3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_668.super__Vector_base<MercuryParticle<3UL>,_std::allocator<MercuryParticle<3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_668.super__Vector_base<MercuryParticle<3UL>,_std::allocator<MercuryParticle<3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_650 = '\x01';
  iVar5 = 0;
  uStack_648 = 0;
  local_8a0 = __filebuf;
  while( true ) {
    puVar9 = &local_6b8;
    puVar10 = local_638;
    for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar10 = *puVar9;
      puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
      puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
    }
    std::vector<MercuryParticle<3UL>,_std::allocator<MercuryParticle<3UL>_>_>::vector
              (&local_5e8,&vStack_668);
    cVar4 = local_650;
    bVar2 = local_730.isEOFTimeStep_;
    local_5d0 = CONCAT71(uStack_64f,local_650);
    uStack_5c8 = uStack_648;
    if (local_5e8.super__Vector_base<MercuryParticle<3UL>,_std::allocator<MercuryParticle<3UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5e8.
                      super__Vector_base<MercuryParticle<3UL>,_std::allocator<MercuryParticle<3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (bVar2 == (bool)cVar4) break;
    std::__cxx11::ostringstream::ostringstream(local_3b8);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3b8,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    local_5c0 = (VTKPointDescriptor<MercuryParticle<3UL>_> *)CONCAT71(local_5c0._1_7_,0x5f);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_5c0,1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,".vtu",4);
    std::__cxx11::stringbuf::str();
    local_5c0 = &local_818;
    std::ofstream::ofstream(&local_5b8,(string *)local_7f0,_S_out);
    if (local_7f0[0] != local_7e0) {
      operator_delete(local_7f0[0]);
    }
    if (*(int *)((long)aiStack_598 + *(long *)(local_5b8 + -0x18)) == 0) {
      if (*(int *)(&infile->field_0x20 + *(long *)(*(long *)infile + -0x18)) != 0) {
        std::enable_if<!((((Log)((signed_char)0))<((Log)-10))||(((Log)0)<((Log)-10))),void>::
        type_Logger<(Log)0>::operator()
                  ((type_Logger<(Log)0> *)&logger,
                   "An IOError occurred during the reading of the input file.\nPlease make sure you are feeding this tool mercury data files."
                  );
        iVar5 = 5;
        goto LAB_00108222;
      }
      VTKUnstructuredGrid<MercuryParticle<3ul>>::write<MercuryTimeStep<3ul>>
                ((VTKUnstructuredGrid<MercuryParticle<3ul>> *)&local_5c0,
                 &local_730.lastReadTimeStep_);
      std::__cxx11::stringbuf::str();
      lVar8 = std::__cxx11::string::rfind((char)(string *)&local_8c0,0x2f);
      if (lVar8 != -1) {
        std::__cxx11::string::substr((ulong)local_750,(ulong)&local_8c0);
        std::__cxx11::string::operator=((string *)&local_8c0,(string *)local_750);
        if (local_750[0] != local_740) {
          operator_delete(local_750[0]);
        }
      }
      local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_898,local_8c0,local_8c0 + local_8b8);
      VTKCollection::append(&local_240,&local_898);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_898._M_dataplus._M_p != &local_898.field_2) {
        operator_delete(local_898._M_dataplus._M_p);
      }
      local_8c8 = local_8c8 + 1;
      if (local_8c0 != local_8b0) {
        operator_delete(local_8c0);
      }
      bVar2 = true;
    }
    else {
      std::__cxx11::stringbuf::str();
      std::enable_if<!((((Log)((signed_char)0))<((Log)-10))||(((Log)0)<((Log)-10))),void>::
      type_Logger<(Log)0>::operator()
                ((type_Logger<(Log)0> *)&logger,
                 "Could not open \'%\' for output.\nPlease make sure you have the appropriate permissions and try again."
                 ,(string *)&local_8c0);
      if (local_8c0 != local_8b0) {
        operator_delete(local_8c0);
      }
      iVar5 = 6;
LAB_00108222:
      bVar2 = false;
    }
    local_5b8 = lVar3;
    *(undefined8 *)(local_5b0 + *(long *)(lVar3 + -0x18) + -8) = local_8a0;
    std::filebuf::~filebuf(local_5b0);
    std::ios_base::~ios_base(local_4c0);
    std::__cxx11::ostringstream::~ostringstream(local_3b8);
    std::ios_base::~ios_base(local_348);
    if (!bVar2) break;
    MercuryTimeStepIterator<3UL>::operator++(&local_730);
  }
  if (vStack_668.super__Vector_base<MercuryParticle<3UL>,_std::allocator<MercuryParticle<3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_668.
                    super__Vector_base<MercuryParticle<3UL>,_std::allocator<MercuryParticle<3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_730.lastReadTimeStep_.storage_.
      super__Vector_base<MercuryParticle<3UL>,_std::allocator<MercuryParticle<3UL>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_730.lastReadTimeStep_.storage_.
                    super__Vector_base<MercuryParticle<3UL>,_std::allocator<MercuryParticle<3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_5c0 = (VTKPointDescriptor<MercuryParticle<3UL>_> *)0x3;
  std::enable_if<!((((Log)((signed_char)0))<((Log)-5))||(((Log)0)<((Log)-5))),void>::
  type_Logger<(Log)0>::operator()
            ((type_Logger<(Log)0> *)&logger,"Written % timesteps in a %D system.",&local_8c8);
  VTKCollection::~VTKCollection(&local_240);
  VTKPointDescriptor<MercuryParticle<3UL>_>::~VTKPointDescriptor(&local_818);
  return iVar5;
}

Assistant:

int transformMercuryToVTK(MercuryDataFile& infile, std::string prefix)
{
  //We really want to describe our exit code.
  int exitCode = 0;
  
  //We'll set up a descriptor.
  //Let the compiler figure out what the types / dimensions are, that's too
  //much work anyway. Oh and make sure position is used as both a datafield
  //and the actual position of the object.
  VTKPointDescriptor< MercuryParticle<NDIMS> > descriptor;
  descriptor
    .addProperty( "Position",    & MercuryParticle< NDIMS >::position , true)
    .addProperty( "Velocity",    & MercuryParticle< NDIMS >::velocity  )
    .addProperty( "Rotation",    & MercuryParticle< NDIMS >::rotation  )
    .addProperty( "AngVelocity", & MercuryParticle< NDIMS >::angularV  )
    .addProperty( "Radius",      & MercuryParticle< NDIMS >::radius    )
    .addProperty( "Species",     & MercuryParticle< NDIMS >::speciesID );
    
  // We want a Collection file which lists all individual files
  VTKCollection collection( prefix + ".pvd" );
  // First, make sure it is sane.
  if (!collection)
    logger( FATAL, "Could not open '%.pvd' for output.\n"
                   "Please make sure you have the appropriate permissions and try again.", prefix);
  
  std::size_t timestepCount = 0;
  
  //Now, read all the timesteps as if they were NDIMS long.
  for (const MercuryTimeStep<NDIMS> & ts : infile.as<NDIMS>())
  {
    //Generate the filename for the individual data files.
    std::ostringstream filename;
    filename << prefix << '_' << ts.getTimeStepID() << ".vtu";
    
    //We'll set up a datafile containing the individual timestep.
    VTKUnstructuredGrid< MercuryParticle<NDIMS> > timeStepFile(filename.str(), &descriptor);
    if (!timeStepFile) //but not after we've done some sanity checking!
    {
      logger(WARN, "Could not open '%' for output.\n"
                   "Please make sure you have the appropriate permissions and try again.", filename.str());
      exitCode = 6;
      break;
    }
    
    if (!infile) //Some sanity checking? More sanity checking! ALL the sanity checking!!!
    {
      logger(WARN, "An IOError occurred during the reading of the input file.\n"
                   "Please make sure you are feeding this tool mercury data files.");
      exitCode = 5; 
      break;
    }
    //Okay. we done.
    //Let's write.
    timeStepFile.write(ts);
    
    //So, a user may give an output path which is in a different directory. 
    // However, since the index files resides in the same output directory
    // as the timestep files, we need to specify relative paths.
    std::string strippedPath = filename.str();
    //so, we try to find the last / - because to hell with everybody with other
    //path seperators...
    std::string::size_type slashPosition = strippedPath.rfind('/');
    //and take only the last part. It's not the last character, trust me.
    //we checked for that in main().
    if (slashPosition != std::string::npos)
      strippedPath = strippedPath.substr(slashPosition + 1);
    //And now put the relative path in the listing file
    collection.append(strippedPath);
    
    timestepCount++;
  }
  
  logger(INFO, "Written % timesteps in a %D system.", timestepCount, NDIMS);
  
  return exitCode;
}